

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O3

Locale * icu_63::Locale::createFromName(Locale *__return_storage_ptr__,char *name)

{
  Locale *other;
  Locale *l;
  
  if (name == (char *)0x0) {
    other = getDefault();
    Locale(__return_storage_ptr__,other);
  }
  else {
    Locale(__return_storage_ptr__,"",(char *)0x0,(char *)0x0,(char *)0x0);
    init(__return_storage_ptr__,(EVP_PKEY_CTX *)name);
  }
  return __return_storage_ptr__;
}

Assistant:

Locale U_EXPORT2
Locale::createFromName (const char *name)
{
    if (name) {
        Locale l("");
        l.init(name, FALSE);
        return l;
    }
    else {
        return getDefault();
    }
}